

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileArgument(LlvmCompilationContext *ctx,TypeBase *argumentType,ExprBase *value)

{
  LLVMValueRef pLVar1;
  TypeBase *valueType;
  LLVMValueRef argument;
  ExprBase *value_local;
  TypeBase *argumentType_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar1 = CompileLlvm(ctx,value);
  valueType = GetStackType(ctx,value->type);
  pLVar1 = ConvertToDataType(ctx,pLVar1,valueType,value->type);
  pLVar1 = CompileArgument(ctx,argumentType,pLVar1);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileArgument(LlvmCompilationContext& ctx, TypeBase* argumentType, ExprBase* value)
{
	LLVMValueRef argument = CompileLlvm(ctx, value);

	argument = ConvertToDataType(ctx, argument, GetStackType(ctx, value->type), value->type);

	return CompileArgument(ctx, argumentType, argument);
}